

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O2

axbStatus_t axbInit(axbHandle_s **handle)

{
  axbHandle_s *paVar1;
  axbMemBackend_s **ppaVar2;
  axbOpBackend_s **ppaVar3;
  
  paVar1 = (axbHandle_s *)malloc(0x38);
  *handle = paVar1;
  paVar1->init = 0x67932;
  paVar1->memBackends_capacity = 10;
  paVar1->memBackends_size = 0;
  ppaVar2 = (axbMemBackend_s **)malloc(0x50);
  paVar1->memBackends = ppaVar2;
  axbMemBackendRegisterDefaults(paVar1);
  paVar1 = *handle;
  paVar1->opBackends_capacity = 10;
  paVar1->opBackends_size = 0;
  ppaVar3 = (axbOpBackend_s **)malloc(0x50);
  paVar1->opBackends = ppaVar3;
  axbOpBackendRegisterDefaults(*handle);
  return 0;
}

Assistant:

axbStatus_t axbInit(struct axbHandle_s **handle)
{
  *handle = malloc(sizeof(struct axbHandle_s));
  (*handle)->init = 424242; // magic number to indicate proper initialization (and track repeated free's)

  (*handle)->memBackends_capacity = 10;
  (*handle)->memBackends_size = 0;
  (*handle)->memBackends = malloc((*handle)->memBackends_capacity * sizeof(struct axbMemBackend_s *));

  axbMemBackendRegisterDefaults(*handle);

  (*handle)->opBackends_capacity = 10;
  (*handle)->opBackends_size = 0;
  (*handle)->opBackends = malloc((*handle)->opBackends_capacity * sizeof(struct axbMemBackend_s *));

  axbOpBackendRegisterDefaults(*handle);

  return 0;
}